

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_converter_init_preallocated
                    (ma_data_converter_config *pConfig,void *pHeap,ma_data_converter *pConverter)

{
  ma_bool8 mVar1;
  ma_bool8 mVar2;
  ma_uint32 mVar3;
  ma_uint32 mVar4;
  ma_bool32 mVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  ma_result mVar9;
  ma_format mVar10;
  ma_data_converter_heap_layout heapLayout;
  ma_channel_converter_config channelConverterConfig;
  ma_data_converter_heap_layout local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [24];
  ma_resampling_backend_vtable *pmStack_40;
  void *local_38;
  float **local_30;
  
  if (pConverter == (ma_data_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  memset(pConverter,0,0x138);
  mVar9 = ma_data_converter_get_heap_layout(pConfig,&local_80);
  if (mVar9 != MA_SUCCESS) {
    return mVar9;
  }
  pConverter->_pHeap = pHeap;
  if (local_80.sizeInBytes != 0 && pHeap != (void *)0x0) {
    memset(pHeap,0,local_80.sizeInBytes);
  }
  local_68._0_4_ = pConfig->formatIn;
  local_68._4_4_ = pConfig->formatOut;
  uStack_60._0_4_ = pConfig->channelsIn;
  uStack_60._4_4_ = pConfig->channelsOut;
  pConverter->formatIn = (undefined4)local_68;
  pConverter->formatOut = local_68._4_4_;
  pConverter->channelsIn = (ma_uint32)uStack_60;
  pConverter->channelsOut = uStack_60._4_4_;
  mVar3 = pConfig->sampleRateIn;
  pConverter->sampleRateIn = mVar3;
  mVar4 = pConfig->sampleRateOut;
  pConverter->sampleRateOut = mVar4;
  pConverter->ditherMode = pConfig->ditherMode;
  mVar5 = pConfig->allowDynamicSampleRate;
  mVar10 = ma_data_converter_config_get_mid_format(pConfig);
  local_58._0_4_ = ma_data_converter_config_get_mid_format(pConfig);
  local_58._4_4_ = (ma_uint32)uStack_60;
  local_58._8_4_ = local_68._4_4_;
  local_58._12_4_ = 0;
  local_58._16_8_ = pConfig->pChannelMapIn;
  pmStack_40 = (ma_resampling_backend_vtable *)pConfig->pChannelMapOut;
  local_30 = pConfig->ppChannelWeights;
  local_38 = *(void **)&pConfig->channelMixMode;
  mVar9 = ma_channel_converter_init_preallocated
                    ((ma_channel_converter_config *)local_58,
                     (void *)(local_80.channelConverterOffset + (long)pHeap),
                     &pConverter->channelConverter);
  if (mVar9 != MA_SUCCESS) {
    return mVar9;
  }
  if ((pConverter->channelConverter).conversionPath != ma_channel_conversion_path_passthrough) {
    pConverter->hasChannelConverter = '\x01';
  }
  if (mVar3 != mVar4 || mVar5 != 0) {
    uVar8 = pConfig->channelsOut;
    if (pConfig->channelsIn < pConfig->channelsOut) {
      uVar8 = pConfig->channelsIn;
    }
    local_58._0_4_ = ma_data_converter_config_get_mid_format(pConfig);
    uVar6 = pConfig->sampleRateIn;
    uVar7 = pConfig->sampleRateOut;
    local_58._20_4_ = 0;
    local_58._16_4_ = (pConfig->resampling).algorithm;
    local_30 = (float **)(ulong)(pConfig->resampling).linear.lpfOrder;
    pmStack_40 = (pConfig->resampling).pBackendVTable;
    local_38 = (pConfig->resampling).pBackendUserData;
    local_58._4_4_ = uVar8;
    local_58._8_4_ = uVar6;
    local_58._12_4_ = uVar7;
    mVar9 = ma_resampler_init_preallocated
                      ((ma_resampler_config *)local_58,
                       (void *)((long)pHeap + local_80.resamplerOffset),&pConverter->resampler);
    if (mVar9 != MA_SUCCESS) {
      return mVar9;
    }
    pConverter->hasResampler = '\x01';
  }
  mVar1 = pConverter->hasChannelConverter;
  if ((mVar1 == '\0') && (pConverter->hasResampler == '\0')) {
    pConverter->hasPreFormatConversion = '\0';
    if (pConverter->formatIn == pConverter->formatOut) {
      pConverter->hasPostFormatConversion = '\0';
      goto LAB_00143beb;
    }
  }
  else {
    if (pConverter->formatIn != mVar10) {
      pConverter->hasPreFormatConversion = '\x01';
    }
    if (pConverter->formatOut == mVar10) goto LAB_00143beb;
  }
  pConverter->hasPostFormatConversion = '\x01';
LAB_00143beb:
  if (((pConverter->hasPreFormatConversion == '\0') &&
      (pConverter->hasPostFormatConversion == '\0' && mVar1 == '\0')) &&
     (pConverter->hasResampler == '\0')) {
    pConverter->isPassthrough = '\x01';
  }
  if (pConverter->isPassthrough != '\0') {
    pConverter->executionPath = ma_data_converter_execution_path_passthrough;
    return MA_SUCCESS;
  }
  mVar2 = pConverter->hasResampler;
  if (pConverter->channelsIn < pConverter->channelsOut) {
    if (mVar2 != '\0') {
      pConverter->executionPath = ma_data_converter_execution_path_resample_first;
      return MA_SUCCESS;
    }
  }
  else {
    if (mVar1 == '\0') {
      if (mVar2 != '\0') {
        pConverter->executionPath = ma_data_converter_execution_path_resample_only;
        return MA_SUCCESS;
      }
      pConverter->executionPath = ma_data_converter_execution_path_format_only;
      return MA_SUCCESS;
    }
    if (mVar2 != '\0') {
      pConverter->executionPath = ma_data_converter_execution_path_channels_first;
      return MA_SUCCESS;
    }
  }
  pConverter->executionPath = ma_data_converter_execution_path_channels_only;
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_data_converter_init_preallocated(const ma_data_converter_config* pConfig, void* pHeap, ma_data_converter* pConverter)
{
    ma_result result;
    ma_data_converter_heap_layout heapLayout;
    ma_format midFormat;
    ma_bool32 isResamplingRequired;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pConverter);

    result = ma_data_converter_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pConverter->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pConverter->formatIn      = pConfig->formatIn;
    pConverter->formatOut     = pConfig->formatOut;
    pConverter->channelsIn    = pConfig->channelsIn;
    pConverter->channelsOut   = pConfig->channelsOut;
    pConverter->sampleRateIn  = pConfig->sampleRateIn;
    pConverter->sampleRateOut = pConfig->sampleRateOut;
    pConverter->ditherMode    = pConfig->ditherMode;

    /*
    Determine if resampling is required. We need to do this so we can determine an appropriate
    mid format to use. If resampling is required, the mid format must be ma_format_f32 since
    that is the only one that is guaranteed to supported by custom resampling backends.
    */
    isResamplingRequired = ma_data_converter_config_is_resampler_required(pConfig);
    midFormat = ma_data_converter_config_get_mid_format(pConfig);


    /* Channel converter. We always initialize this, but we check if it configures itself as a passthrough to determine whether or not it's needed. */
    {
        ma_channel_converter_config channelConverterConfig = ma_channel_converter_config_init_from_data_converter_config(pConfig);

        result = ma_channel_converter_init_preallocated(&channelConverterConfig, ma_offset_ptr(pHeap, heapLayout.channelConverterOffset), &pConverter->channelConverter);
        if (result != MA_SUCCESS) {
            return result;
        }

        /* If the channel converter is not a passthrough we need to enable it. Otherwise we can skip it. */
        if (pConverter->channelConverter.conversionPath != ma_channel_conversion_path_passthrough) {
            pConverter->hasChannelConverter = MA_TRUE;
        }
    }


    /* Resampler. */
    if (isResamplingRequired) {
        ma_resampler_config resamplerConfig = ma_resampler_config_init_from_data_converter_config(pConfig);

        result = ma_resampler_init_preallocated(&resamplerConfig, ma_offset_ptr(pHeap, heapLayout.resamplerOffset), &pConverter->resampler);
        if (result != MA_SUCCESS) {
            return result;
        }

        pConverter->hasResampler = MA_TRUE;
    }


    /* We can simplify pre- and post-format conversion if we have neither channel conversion nor resampling. */
    if (pConverter->hasChannelConverter == MA_FALSE && pConverter->hasResampler == MA_FALSE) {
        /* We have neither channel conversion nor resampling so we'll only need one of pre- or post-format conversion, or none if the input and output formats are the same. */
        if (pConverter->formatIn == pConverter->formatOut) {
            /* The formats are the same so we can just pass through. */
            pConverter->hasPreFormatConversion  = MA_FALSE;
            pConverter->hasPostFormatConversion = MA_FALSE;
        } else {
            /* The formats are different so we need to do either pre- or post-format conversion. It doesn't matter which. */
            pConverter->hasPreFormatConversion  = MA_FALSE;
            pConverter->hasPostFormatConversion = MA_TRUE;
        }
    } else {
        /* We have a channel converter and/or resampler so we'll need channel conversion based on the mid format. */
        if (pConverter->formatIn != midFormat) {
            pConverter->hasPreFormatConversion  = MA_TRUE;
        }
        if (pConverter->formatOut != midFormat) {
            pConverter->hasPostFormatConversion = MA_TRUE;
        }
    }

    /* We can enable passthrough optimizations if applicable. Note that we'll only be able to do this if the sample rate is static. */
    if (pConverter->hasPreFormatConversion  == MA_FALSE &&
        pConverter->hasPostFormatConversion == MA_FALSE &&
        pConverter->hasChannelConverter     == MA_FALSE &&
        pConverter->hasResampler            == MA_FALSE) {
        pConverter->isPassthrough = MA_TRUE;
    }


    /* We now need to determine our execution path. */
    if (pConverter->isPassthrough) {
        pConverter->executionPath = ma_data_converter_execution_path_passthrough;
    } else {
        if (pConverter->channelsIn < pConverter->channelsOut) {
            /* Do resampling first, if necessary. */
            MA_ASSERT(pConverter->hasChannelConverter == MA_TRUE);

            if (pConverter->hasResampler) {
                pConverter->executionPath = ma_data_converter_execution_path_resample_first;
            } else {
                pConverter->executionPath = ma_data_converter_execution_path_channels_only;
            }
        } else {
            /* Do channel conversion first, if necessary. */
            if (pConverter->hasChannelConverter) {
                if (pConverter->hasResampler) {
                    pConverter->executionPath = ma_data_converter_execution_path_channels_first;
                } else {
                    pConverter->executionPath = ma_data_converter_execution_path_channels_only;
                }
            } else {
                /* Channel routing not required. */
                if (pConverter->hasResampler) {
                    pConverter->executionPath = ma_data_converter_execution_path_resample_only;
                } else {
                    pConverter->executionPath = ma_data_converter_execution_path_format_only;
                }
            }
        }
    }

    return MA_SUCCESS;
}